

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<34>::ReactionBlock::ReactionBlock
          (ReactionBlock *this,int mt,int mt1,int nl,int nl1,
          vector<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
          *lblocks)

{
  pointer pLVar1;
  
  this->mt1_ = mt1;
  this->nl_ = nl;
  this->nl1_ = nl1;
  pLVar1 = (lblocks->
           super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->lblocks_).
  super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (lblocks->
       super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->lblocks_).
  super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = pLVar1;
  (this->lblocks_).
  super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (lblocks->
       super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (lblocks->
  super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (lblocks->
  super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (lblocks->
  super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verifySize(nl,nl1,(int)((ulong)((long)(this->lblocks_).
                                        super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->lblocks_).
                                       super__Vector_base<njoy::ENDFtk::section::Type<34>::LegendreBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::LegendreBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x33333333,mt == mt1);
  return;
}

Assistant:

ReactionBlock( int mt, int mt1, int nl, int nl1,
               std::vector< LegendreBlock >&& lblocks ) :
  mt1_( mt1 ), nl_( nl ), nl1_( nl1 ),
  lblocks_( std::move( lblocks) ) {
    verifySize(nl, nl1, lblocks_.size(), mt==mt1 );
  }